

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall SkylineBinPack::Init(SkylineBinPack *this,int width,int height,bool useWasteMap_)

{
  TArray<Rect,_Rect> *this_00;
  undefined1 local_28 [8];
  SkylineNode node;
  bool useWasteMap__local;
  int height_local;
  int width_local;
  SkylineBinPack *this_local;
  
  this->binWidth = width;
  this->binHeight = height;
  this->useWasteMap = useWasteMap_;
  node.y._3_1_ = useWasteMap_;
  node.width = height;
  DisjointRectCollection::Clear(&this->disjointRects);
  this->usedSurfaceArea = 0;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Clear(&this->skyLine);
  local_28._0_4_ = 0;
  local_28._4_4_ = 0;
  node.x = this->binWidth;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Push
            (&this->skyLine,(SkylineNode *)local_28);
  if ((this->useWasteMap & 1U) != 0) {
    GuillotineBinPack::Init(&this->wasteMap,width,node.width);
    this_00 = GuillotineBinPack::GetFreeRectangles(&this->wasteMap);
    TArray<Rect,_Rect>::Clear(this_00);
  }
  return;
}

Assistant:

void SkylineBinPack::Init(int width, int height, bool useWasteMap_)
{
	binWidth = width;
	binHeight = height;

	useWasteMap = useWasteMap_;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	usedSurfaceArea = 0;
	skyLine.Clear();
	SkylineNode node;
	node.x = 0;
	node.y = 0;
	node.width = binWidth;
	skyLine.Push(node);

	if (useWasteMap)
	{
		wasteMap.Init(width, height);
		wasteMap.GetFreeRectangles().Clear();
	}
}